

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O1

void __thiscall TCLAP::ArgException::~ArgException(ArgException *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__ArgException_0013a9b8;
  pcVar1 = (this->_typeDescription)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_typeDescription).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->_argId)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_argId).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->_errorText)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_errorText).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~ArgException() throw() { }